

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *
kj::tryParseHttpMethodAllowingConnect
          (Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *__return_storage_ptr__,
          StringPtr name)

{
  char *ptr;
  Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> result;
  char *local_30;
  Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> local_28;
  
  local_30 = name.content.ptr;
  consumeHttpMethod(&local_28,&local_30);
  if (*local_30 == '\0') {
    Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::Maybe
              (__return_storage_ptr__,&local_28);
  }
  else {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::OneOf<HttpMethod, HttpConnectMethod>> tryParseHttpMethodAllowingConnect(
    kj::StringPtr name) {
  // const_cast OK because we don't actually access it. consumeHttpMethod() is also called by some
  // code later than explicitly needs to use a non-const pointer.
  char* ptr = const_cast<char*>(name.begin());
  auto result = consumeHttpMethod(ptr);
  if (*ptr == '\0') {
    return result;
  } else {
    return kj::none;
  }
}